

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void ge_p2_dbl(ge_p1p1 *r,ge_p2 *p)

{
  undefined1 local_b8 [8];
  fe t0;
  fe trT;
  fe trZ;
  fe trX;
  ge_p2 *p_local;
  ge_p1p1 *r_local;
  
  fe_sq_tt((fe *)(trZ.v + 4),&p->X);
  fe_sq_tt((fe *)(trT.v + 4),&p->Y);
  fe_sq2_tt((fe *)(t0.v + 4),&p->Z);
  fe_add(&r->Y,&p->X,&p->Y);
  fe_sq_tl((fe *)local_b8,&r->Y);
  fe_add(&r->Y,(fe *)(trT.v + 4),(fe *)(trZ.v + 4));
  fe_sub(&r->Z,(fe *)(trT.v + 4),(fe *)(trZ.v + 4));
  fe_carry((fe *)(trT.v + 4),&r->Y);
  fe_sub(&r->X,(fe *)local_b8,(fe *)(trT.v + 4));
  fe_carry((fe *)(trT.v + 4),&r->Z);
  fe_sub(&r->T,(fe *)(t0.v + 4),(fe *)(trT.v + 4));
  return;
}

Assistant:

static void ge_p2_dbl(ge_p1p1 *r, const ge_p2 *p) {
  fe trX, trZ, trT;
  fe t0;

  fe_sq_tt(&trX, &p->X);
  fe_sq_tt(&trZ, &p->Y);
  fe_sq2_tt(&trT, &p->Z);
  fe_add(&r->Y, &p->X, &p->Y);
  fe_sq_tl(&t0, &r->Y);

  fe_add(&r->Y, &trZ, &trX);
  fe_sub(&r->Z, &trZ, &trX);
  fe_carry(&trZ, &r->Y);
  fe_sub(&r->X, &t0, &trZ);
  fe_carry(&trZ, &r->Z);
  fe_sub(&r->T, &trT, &trZ);
}